

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_prove_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  long in_RCX;
  uint uVar51;
  long in_RDX;
  long in_RSI;
  ulong uVar52;
  ulong uVar53;
  long in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  undefined1 (*in_stack_00000008) [16];
  word128 tmp1_2 [2];
  uint j_2;
  uint m_3;
  __m128i carry_4;
  __m128i total_carry_4;
  word128 tmp2_1 [2];
  word128 tmp1_1 [2];
  uint j_1;
  uint m_2;
  word128 tmp2 [2];
  word128 tmp1 [2];
  uint j;
  uint m_1;
  __m128i carry_3;
  __m128i total_carry_3;
  __m128i carry_2;
  __m128i total_carry_2;
  __m128i carry_1;
  __m128i total_carry_1;
  __m128i carry;
  __m128i total_carry;
  uint m;
  word128 bitm_c [2];
  word128 bitm_b [2];
  word128 bitm_a [2];
  word128 tmp [2];
  word128 x2m [3] [2];
  word128 x1s [3] [2];
  word128 x0s [3] [2];
  word128 r2m [3] [2];
  word128 r1s [3] [2];
  word128 r1m [3] [2];
  word128 r0s [3] [2];
  word128 r0m [3] [2];
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  uint local_1b4c;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  ulong local_1b28;
  ulong uStack_1b20;
  ulong local_1b18;
  ulong uStack_1b10;
  ulong local_1b08;
  ulong uStack_1b00;
  ulong local_1af8;
  ulong uStack_1af0;
  uint local_1adc;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  ulong local_1ab8;
  ulong uStack_1ab0;
  ulong local_1aa8;
  ulong uStack_1aa0;
  ulong local_1a98;
  ulong uStack_1a90;
  ulong local_1a88;
  ulong uStack_1a80;
  uint local_1a6c;
  ulong local_1a68;
  ulong uStack_1a60;
  ulong local_1a58;
  ulong uStack_1a50;
  ulong local_1a48;
  ulong uStack_1a40;
  ulong local_1a38;
  ulong uStack_1a30;
  uint local_1a1c;
  undefined8 local_1a18;
  undefined8 uStack_1a10;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  uint local_198c;
  undefined1 local_1988 [32];
  undefined1 local_1968 [32];
  undefined1 local_1948 [32];
  undefined1 local_1928 [32];
  ulong local_1908 [2];
  ulong auStack_18f8 [10];
  ulong local_18a8 [2];
  ulong auStack_1898 [10];
  ulong local_1848 [2];
  ulong auStack_1838 [10];
  ulong local_17e8 [2];
  ulong auStack_17d8 [10];
  ulong local_1788 [2];
  ulong auStack_1778 [10];
  ulong local_1728 [2];
  ulong auStack_1718 [10];
  ulong local_16c8 [2];
  ulong auStack_16b8 [10];
  ulong local_1668 [2];
  ulong auStack_1658 [16];
  long local_15d8;
  ulong *local_15d0;
  long local_15c8;
  ulong *local_15c0;
  undefined1 (*local_15b8) [16];
  undefined1 (*local_15b0) [16];
  undefined1 (*local_15a8) [16];
  undefined1 (*local_15a0) [16];
  undefined1 (*local_1598) [16];
  undefined1 (*local_1588) [16];
  undefined1 (*local_1578) [16];
  ulong *local_1568;
  ulong *local_1560;
  ulong *local_1558;
  ulong *local_1550;
  ulong *local_1548;
  ulong *local_1540;
  ulong *local_1538;
  ulong *local_1530;
  ulong *local_1528;
  ulong *local_1520;
  ulong *local_1518;
  ulong *local_1510;
  ulong *local_1508;
  ulong *local_1500;
  ulong *local_14f8;
  ulong *local_14f0;
  ulong *local_14e8;
  ulong *local_14e0;
  ulong *local_14d8;
  ulong *local_14d0;
  ulong *local_14c8;
  ulong *local_14c0;
  ulong *local_14b8;
  ulong *local_14b0;
  ulong *local_14a8;
  ulong *local_14a0;
  ulong *local_1498;
  undefined1 *local_1490;
  undefined1 *local_1488;
  undefined1 (*local_1480) [16];
  undefined1 *local_1478;
  undefined1 *local_1470;
  undefined1 (*local_1468) [16];
  undefined1 *local_1460;
  undefined1 *local_1458;
  undefined1 (*local_1450) [16];
  undefined1 *local_1448;
  undefined1 *local_1440;
  undefined1 (*local_1438) [16];
  undefined1 *local_1430;
  undefined1 *local_1428;
  undefined1 (*local_1420) [16];
  undefined1 *local_1418;
  undefined1 *local_1410;
  undefined1 (*local_1408) [16];
  undefined4 local_13fc;
  ulong local_13f8;
  ulong uStack_13f0;
  undefined4 local_13dc;
  ulong local_13d8;
  ulong uStack_13d0;
  undefined4 local_13bc;
  ulong local_13b8;
  ulong uStack_13b0;
  undefined4 local_139c;
  ulong local_1398;
  ulong uStack_1390;
  undefined4 local_137c;
  ulong local_1378;
  ulong uStack_1370;
  undefined4 local_135c;
  ulong local_1358;
  ulong uStack_1350;
  undefined4 local_133c;
  ulong local_1338;
  ulong uStack_1330;
  undefined4 local_131c;
  ulong local_1318;
  ulong uStack_1310;
  undefined4 local_12fc;
  undefined1 local_12f8 [16];
  undefined4 local_12dc;
  undefined1 local_12d8 [16];
  undefined4 local_12bc;
  undefined1 local_12b8 [16];
  undefined4 local_129c;
  undefined1 local_1298 [16];
  undefined4 local_127c;
  undefined1 local_1278 [16];
  undefined4 local_125c;
  undefined1 local_1258 [16];
  undefined4 local_123c;
  undefined1 local_1238 [16];
  undefined4 local_121c;
  undefined1 local_1218 [16];
  undefined4 local_11fc;
  undefined1 local_11f8 [16];
  undefined4 local_11dc;
  undefined1 local_11d8 [16];
  undefined4 local_11bc;
  undefined1 local_11b8 [16];
  undefined4 local_119c;
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  ulong local_1178;
  ulong uStack_1170;
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined1 local_1158 [16];
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined1 local_1138 [16];
  undefined8 local_1128;
  undefined8 uStack_1120;
  ulong local_1118;
  ulong uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  undefined1 local_10d8 [16];
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  ulong local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined1 local_1098 [16];
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined1 local_1078 [16];
  undefined8 local_1068;
  undefined8 uStack_1060;
  ulong local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined1 local_1018 [16];
  undefined8 local_1008;
  undefined8 uStack_1000;
  ulong local_ff8;
  ulong uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined1 local_fb8 [16];
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  ulong local_f98;
  ulong uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined1 local_f78 [16];
  undefined8 local_f68;
  undefined8 uStack_f60;
  undefined1 local_f58 [16];
  undefined8 local_f48;
  undefined8 uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined1 local_f18 [16];
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined1 local_ef8 [16];
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  ulong local_ed8;
  ulong uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined1 local_eb8 [16];
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined1 local_e98 [16];
  undefined4 local_e7c;
  undefined1 local_e78 [16];
  undefined4 local_e5c;
  undefined1 local_e58 [16];
  undefined4 local_e3c;
  undefined1 local_e38 [16];
  undefined4 local_e1c;
  undefined1 local_e18 [16];
  undefined4 local_dfc;
  undefined1 local_df8 [16];
  undefined4 local_ddc;
  undefined1 local_dd8 [16];
  undefined4 local_dbc;
  undefined1 local_db8 [16];
  undefined4 local_d9c;
  undefined1 local_d98 [16];
  undefined4 local_d7c;
  undefined1 local_d78 [16];
  undefined4 local_d5c;
  undefined1 local_d58 [16];
  undefined4 local_d3c;
  undefined1 local_d38 [16];
  undefined4 local_d1c;
  undefined1 local_d18 [16];
  undefined4 local_cfc;
  ulong local_cf8;
  ulong uStack_cf0;
  undefined4 local_cdc;
  ulong local_cd8;
  ulong uStack_cd0;
  undefined4 local_cbc;
  ulong local_cb8;
  ulong uStack_cb0;
  undefined4 local_c9c;
  ulong local_c98;
  ulong uStack_c90;
  undefined4 local_c7c;
  ulong local_c78;
  ulong uStack_c70;
  undefined4 local_c5c;
  ulong local_c58;
  ulong uStack_c50;
  undefined4 local_c3c;
  ulong local_c38;
  ulong uStack_c30;
  undefined4 local_c1c;
  ulong local_c18;
  ulong uStack_c10;
  ulong *local_c00;
  ulong *local_bf8;
  ulong *local_bf0;
  ulong *local_be8;
  ulong *local_be0;
  ulong *local_bd8;
  ulong *local_bd0;
  ulong *local_bc8;
  ulong *local_bc0;
  ulong *local_bb8;
  ulong *local_bb0;
  ulong *local_ba8;
  ulong *local_ba0;
  ulong *local_b98;
  ulong *local_b90;
  ulong *local_b88;
  ulong *local_b80;
  ulong *local_b78;
  ulong *local_b70;
  ulong *local_b68;
  ulong *local_b60;
  ulong *local_b58;
  ulong *local_b50;
  ulong *local_b48;
  ulong *local_b40;
  ulong *local_b38;
  ulong *local_b30;
  ulong *local_b28;
  ulong *local_b20;
  ulong *local_b18;
  ulong *local_b10;
  ulong *local_b08;
  ulong *local_b00;
  ulong *local_af8;
  ulong *local_af0;
  ulong *local_ae8;
  ulong *local_ae0;
  ulong *local_ad8;
  ulong *local_ad0;
  ulong *local_ac8;
  ulong *local_ac0;
  ulong *local_ab8;
  ulong *local_ab0;
  ulong *local_aa8;
  ulong *local_aa0;
  ulong *local_a98;
  ulong *local_a90;
  ulong *local_a88;
  ulong *local_a80;
  ulong *local_a78;
  ulong *local_a70;
  ulong *local_a68;
  ulong *local_a60;
  ulong *local_a58;
  ulong *local_a50;
  ulong *local_a48;
  ulong *local_a40;
  ulong *local_a38;
  ulong *local_a30;
  ulong *local_a28;
  ulong *local_a20;
  ulong *local_a18;
  ulong *local_a10;
  ulong local_a08;
  ulong uStack_a00;
  ulong *local_9f0;
  ulong local_9e8;
  ulong uStack_9e0;
  ulong *local_9d0;
  ulong local_9c8;
  ulong uStack_9c0;
  ulong *local_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  ulong *local_990;
  ulong local_988;
  ulong uStack_980;
  ulong *local_970;
  ulong local_968;
  ulong uStack_960;
  ulong *local_950;
  ulong local_948;
  ulong uStack_940;
  ulong *local_930;
  ulong local_928;
  ulong uStack_920;
  ulong *local_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  ulong uStack_780;
  undefined8 local_778;
  ulong uStack_770;
  ulong local_768;
  ulong uStack_760;
  ulong local_758;
  ulong uStack_750;
  undefined8 local_748;
  ulong uStack_740;
  undefined8 local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  ulong local_718;
  ulong uStack_710;
  undefined8 local_708;
  ulong uStack_700;
  undefined8 local_6f8;
  ulong uStack_6f0;
  ulong local_6e8;
  ulong uStack_6e0;
  ulong local_6d8;
  ulong uStack_6d0;
  undefined8 local_6c8;
  ulong uStack_6c0;
  undefined8 local_6b8;
  __m128i carry_7;
  __m128i total_carry_7;
  __m128i carry_6;
  __m128i total_carry_6;
  uint m_4;
  __m128i carry_5;
  __m128i total_carry_5;
  
  local_8e8 = *(undefined8 *)*in_R8;
  uStack_8e0 = *(undefined8 *)(*in_R8 + 8);
  auVar15 = *in_R8;
  auVar2 = *in_R8;
  local_1578 = in_R8 + 1;
  local_908 = *(undefined8 *)*local_1578;
  uStack_900 = *(undefined8 *)(in_R8[1] + 8);
  auVar11 = *local_1578;
  auVar3 = *local_1578;
  local_8a8 = *(undefined8 *)*in_R9;
  uStack_8a0 = *(undefined8 *)(*in_R9 + 8);
  auVar12 = *in_R9;
  auVar4 = *in_R9;
  local_1588 = in_R9 + 1;
  local_8c8 = *(undefined8 *)*local_1588;
  uStack_8c0 = *(undefined8 *)(in_R9[1] + 8);
  auVar40 = *local_1588;
  auVar5 = *local_1588;
  local_868 = *(undefined8 *)*in_stack_00000008;
  uStack_860 = *(undefined8 *)(*in_stack_00000008 + 8);
  auVar41 = *in_stack_00000008;
  auVar9 = *in_stack_00000008;
  local_1598 = in_stack_00000008 + 1;
  local_888 = *(undefined8 *)*local_1598;
  uStack_880 = *(undefined8 *)(in_stack_00000008[1] + 8);
  auVar42 = *local_1598;
  auVar10 = *local_1598;
  for (local_198c = 0; local_198c < 3; local_198c = local_198c + 1) {
    local_15a0 = (undefined1 (*) [16])(in_RSI + (ulong)local_198c * 0x20);
    local_8d8 = *(undefined8 *)*local_15a0;
    uStack_8d0 = *(undefined8 *)(*local_15a0 + 8);
    auVar34 = *local_15a0;
    auVar13 = *local_15a0;
    lVar43 = in_RSI + (ulong)local_198c * 0x20;
    local_15a8 = (undefined1 (*) [16])(lVar43 + 0x10);
    local_8f8 = *(undefined8 *)*local_15a8;
    uStack_8f0 = *(undefined8 *)(lVar43 + 0x18);
    auVar35 = *local_15a8;
    auVar14 = *local_15a8;
    auVar6 = *local_15a8;
    local_1408 = (undefined1 (*) [16])(local_1848 + (ulong)local_198c * 4);
    local_1410 = local_1928;
    local_1418 = local_1948;
    auVar1 = vpand_avx(*local_15a0,auVar2);
    *(undefined1 (*) [16])(local_1848 + (ulong)local_198c * 4) = auVar1;
    auVar1 = vpand_avx(auVar6,auVar3);
    *(undefined1 (*) [16])(auStack_1838 + (ulong)local_198c * 4) = auVar1;
    local_1420 = (undefined1 (*) [16])(local_18a8 + (ulong)local_198c * 4);
    local_1428 = local_1928;
    local_1430 = local_1968;
    local_898 = local_8d8;
    uStack_890 = uStack_8d0;
    auVar1 = vpand_avx(auVar13,auVar4);
    *(undefined1 (*) [16])(local_18a8 + (ulong)local_198c * 4) = auVar1;
    local_8b8 = local_8f8;
    uStack_8b0 = uStack_8f0;
    auVar1 = vpand_avx(auVar14,auVar5);
    *(undefined1 (*) [16])(auStack_1898 + (ulong)local_198c * 4) = auVar1;
    local_1438 = (undefined1 (*) [16])(local_1908 + (ulong)local_198c * 4);
    local_1440 = local_1928;
    local_1448 = local_1988;
    local_858 = local_8d8;
    uStack_850 = uStack_8d0;
    auVar1 = vpand_avx(auVar34,auVar9);
    *(undefined1 (*) [16])(local_1908 + (ulong)local_198c * 4) = auVar1;
    local_878 = local_8f8;
    uStack_870 = uStack_8f0;
    auVar1 = vpand_avx(auVar35,auVar10);
    *(undefined1 (*) [16])(auStack_18f8 + (ulong)local_198c * 4) = auVar1;
    local_1198 = vpsrldq_avx(*(undefined1 (*) [16])(local_1848 + (ulong)local_198c * 4),8);
    local_119c = 0x3e;
    auVar6 = vpsrlq_avx(local_1198,ZEXT416(0x3e));
    local_11b8 = vpslldq_avx(*(undefined1 (*) [16])(local_1848 + (ulong)local_198c * 4),8);
    local_11bc = 0x3e;
    auVar1 = vpsrlq_avx(local_11b8,ZEXT416(0x3e));
    local_c18 = local_1848[(ulong)local_198c * 4];
    uStack_c10 = local_1848[(ulong)local_198c * 4 + 1];
    local_c1c = 2;
    auVar27._8_8_ = local_1848[(ulong)local_198c * 4 + 1];
    auVar27._0_8_ = local_1848[(ulong)local_198c * 4];
    local_e98 = vpsllq_avx(auVar27,ZEXT416(2));
    local_19b8 = auVar1._0_8_;
    uStack_19b0 = auVar1._8_8_;
    local_ea8 = local_19b8;
    uStack_ea0 = uStack_19b0;
    auVar1 = vpor_avx(local_e98,auVar1);
    *(undefined1 (*) [16])(local_1848 + (ulong)local_198c * 4) = auVar1;
    local_11d8 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1838 + (ulong)local_198c * 4),8);
    local_11dc = 0x3e;
    auVar1 = vpsrlq_avx(local_11d8,ZEXT416(0x3e));
    local_c38 = auStack_1838[(ulong)local_198c * 4];
    uStack_c30 = auStack_1838[(ulong)local_198c * 4 + 1];
    local_c3c = 2;
    auVar26._8_8_ = auStack_1838[(ulong)local_198c * 4 + 1];
    auVar26._0_8_ = auStack_1838[(ulong)local_198c * 4];
    local_eb8 = vpsllq_avx(auVar26,ZEXT416(2));
    local_19b8 = auVar1._0_8_;
    uStack_19b0 = auVar1._8_8_;
    local_ec8 = local_19b8;
    uStack_ec0 = uStack_19b0;
    auVar1 = vpor_avx(local_eb8,auVar1);
    *(undefined1 (*) [16])(auStack_1838 + (ulong)local_198c * 4) = auVar1;
    local_19a8 = auVar6._0_8_;
    uStack_19a0 = auVar6._8_8_;
    local_ed8 = auStack_1838[(ulong)local_198c * 4];
    uStack_ed0 = auStack_1838[(ulong)local_198c * 4 + 1];
    local_ee8 = local_19a8;
    uStack_ee0 = uStack_19a0;
    auVar19._8_8_ = auStack_1838[(ulong)local_198c * 4 + 1];
    auVar19._0_8_ = auStack_1838[(ulong)local_198c * 4];
    auVar1 = vpor_avx(auVar19,auVar6);
    *(undefined1 (*) [16])(auStack_1838 + (ulong)local_198c * 4) = auVar1;
    local_11f8 = vpsrldq_avx(*(undefined1 (*) [16])(local_18a8 + (ulong)local_198c * 4),8);
    local_11fc = 0x3f;
    auVar6 = vpsrlq_avx(local_11f8,ZEXT416(0x3f));
    local_1218 = vpslldq_avx(*(undefined1 (*) [16])(local_18a8 + (ulong)local_198c * 4),8);
    local_121c = 0x3f;
    auVar1 = vpsrlq_avx(local_1218,ZEXT416(0x3f));
    local_c58 = local_18a8[(ulong)local_198c * 4];
    uStack_c50 = local_18a8[(ulong)local_198c * 4 + 1];
    local_c5c = 1;
    auVar25._8_8_ = local_18a8[(ulong)local_198c * 4 + 1];
    auVar25._0_8_ = local_18a8[(ulong)local_198c * 4];
    local_ef8 = vpsllq_avx(auVar25,ZEXT416(1));
    local_19d8 = auVar1._0_8_;
    uStack_19d0 = auVar1._8_8_;
    local_f08 = local_19d8;
    uStack_f00 = uStack_19d0;
    auVar1 = vpor_avx(local_ef8,auVar1);
    *(undefined1 (*) [16])(local_18a8 + (ulong)local_198c * 4) = auVar1;
    local_1238 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1898 + (ulong)local_198c * 4),8);
    local_123c = 0x3f;
    auVar1 = vpsrlq_avx(local_1238,ZEXT416(0x3f));
    local_c78 = auStack_1898[(ulong)local_198c * 4];
    uStack_c70 = auStack_1898[(ulong)local_198c * 4 + 1];
    local_c7c = 1;
    auVar24._8_8_ = auStack_1898[(ulong)local_198c * 4 + 1];
    auVar24._0_8_ = auStack_1898[(ulong)local_198c * 4];
    local_f18 = vpsllq_avx(auVar24,ZEXT416(1));
    local_19d8 = auVar1._0_8_;
    uStack_19d0 = auVar1._8_8_;
    local_f28 = local_19d8;
    uStack_f20 = uStack_19d0;
    auVar1 = vpor_avx(local_f18,auVar1);
    *(undefined1 (*) [16])(auStack_1898 + (ulong)local_198c * 4) = auVar1;
    local_19c8 = auVar6._0_8_;
    uStack_19c0 = auVar6._8_8_;
    local_f38 = auStack_1898[(ulong)local_198c * 4];
    uStack_f30 = auStack_1898[(ulong)local_198c * 4 + 1];
    local_f48 = local_19c8;
    uStack_f40 = uStack_19c0;
    auVar18._8_8_ = auStack_1898[(ulong)local_198c * 4 + 1];
    auVar18._0_8_ = auStack_1898[(ulong)local_198c * 4];
    auVar1 = vpor_avx(auVar18,auVar6);
    *(undefined1 (*) [16])(auStack_1898 + (ulong)local_198c * 4) = auVar1;
    local_15b0 = (undefined1 (*) [16])(in_RCX + (ulong)local_198c * 0x20);
    local_818 = *(undefined8 *)*local_15b0;
    uStack_810 = *(undefined8 *)(*local_15b0 + 8);
    auVar34 = *local_15b0;
    auVar13 = *local_15b0;
    lVar43 = in_RCX + (ulong)local_198c * 0x20;
    local_15b8 = (undefined1 (*) [16])(lVar43 + 0x10);
    local_838 = *(undefined8 *)*local_15b8;
    uStack_830 = *(undefined8 *)(lVar43 + 0x18);
    auVar35 = *local_15b8;
    auVar14 = *local_15b8;
    auVar6 = *local_15b8;
    local_1450 = (undefined1 (*) [16])(local_1668 + (ulong)local_198c * 4);
    local_1458 = local_1928;
    local_1460 = local_1948;
    local_828 = local_8e8;
    uStack_820 = uStack_8e0;
    auVar1 = vpand_avx(*local_15b0,auVar15);
    *(undefined1 (*) [16])(local_1668 + (ulong)local_198c * 4) = auVar1;
    local_848 = local_908;
    uStack_840 = uStack_900;
    auVar1 = vpand_avx(auVar6,auVar11);
    *(undefined1 (*) [16])(auStack_1658 + (ulong)local_198c * 4) = auVar1;
    local_1468 = (undefined1 (*) [16])(local_1728 + (ulong)local_198c * 4);
    local_1470 = local_1928;
    local_1478 = local_1968;
    local_7d8 = local_818;
    uStack_7d0 = uStack_810;
    local_7e8 = local_8a8;
    uStack_7e0 = uStack_8a0;
    auVar1 = vpand_avx(auVar13,auVar12);
    *(undefined1 (*) [16])(local_1728 + (ulong)local_198c * 4) = auVar1;
    local_7f8 = local_838;
    uStack_7f0 = uStack_830;
    local_808 = local_8c8;
    uStack_800 = uStack_8c0;
    auVar1 = vpand_avx(auVar14,auVar40);
    *(undefined1 (*) [16])(auStack_1718 + (ulong)local_198c * 4) = auVar1;
    local_1480 = (undefined1 (*) [16])(local_17e8 + (ulong)local_198c * 4);
    local_1488 = local_1928;
    local_1490 = local_1988;
    local_798 = local_818;
    uStack_790 = uStack_810;
    local_7a8 = local_868;
    uStack_7a0 = uStack_860;
    auVar1 = vpand_avx(auVar34,auVar41);
    *(undefined1 (*) [16])(local_17e8 + (ulong)local_198c * 4) = auVar1;
    local_7b8 = local_838;
    uStack_7b0 = uStack_830;
    local_7c8 = local_888;
    uStack_7c0 = uStack_880;
    auVar1 = vpand_avx(auVar35,auVar42);
    *(undefined1 (*) [16])(auStack_17d8 + (ulong)local_198c * 4) = auVar1;
    local_1258 = vpsrldq_avx(*(undefined1 (*) [16])(local_1668 + (ulong)local_198c * 4),8);
    local_125c = 0x3e;
    auVar6 = vpsrlq_avx(local_1258,ZEXT416(0x3e));
    local_1278 = vpslldq_avx(*(undefined1 (*) [16])(local_1668 + (ulong)local_198c * 4),8);
    local_127c = 0x3e;
    auVar1 = vpsrlq_avx(local_1278,ZEXT416(0x3e));
    local_c98 = local_1668[(ulong)local_198c * 4];
    uStack_c90 = local_1668[(ulong)local_198c * 4 + 1];
    local_c9c = 2;
    auVar23._8_8_ = local_1668[(ulong)local_198c * 4 + 1];
    auVar23._0_8_ = local_1668[(ulong)local_198c * 4];
    local_f58 = vpsllq_avx(auVar23,ZEXT416(2));
    local_19f8 = auVar1._0_8_;
    uStack_19f0 = auVar1._8_8_;
    local_f68 = local_19f8;
    uStack_f60 = uStack_19f0;
    auVar1 = vpor_avx(local_f58,auVar1);
    *(undefined1 (*) [16])(local_16c8 + (ulong)local_198c * 4) = auVar1;
    local_1298 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1658 + (ulong)local_198c * 4),8);
    local_129c = 0x3e;
    auVar1 = vpsrlq_avx(local_1298,ZEXT416(0x3e));
    local_cb8 = auStack_1658[(ulong)local_198c * 4];
    uStack_cb0 = auStack_1658[(ulong)local_198c * 4 + 1];
    local_cbc = 2;
    auVar22._8_8_ = auStack_1658[(ulong)local_198c * 4 + 1];
    auVar22._0_8_ = auStack_1658[(ulong)local_198c * 4];
    local_f78 = vpsllq_avx(auVar22,ZEXT416(2));
    local_19f8 = auVar1._0_8_;
    uStack_19f0 = auVar1._8_8_;
    local_f88 = local_19f8;
    uStack_f80 = uStack_19f0;
    auVar1 = vpor_avx(local_f78,auVar1);
    *(undefined1 (*) [16])(auStack_16b8 + (ulong)local_198c * 4) = auVar1;
    local_19e8 = auVar6._0_8_;
    uStack_19e0 = auVar6._8_8_;
    local_f98 = auStack_16b8[(ulong)local_198c * 4];
    uStack_f90 = auStack_16b8[(ulong)local_198c * 4 + 1];
    local_fa8 = local_19e8;
    uStack_fa0 = uStack_19e0;
    auVar17._8_8_ = auStack_16b8[(ulong)local_198c * 4 + 1];
    auVar17._0_8_ = auStack_16b8[(ulong)local_198c * 4];
    auVar1 = vpor_avx(auVar17,auVar6);
    *(undefined1 (*) [16])(auStack_16b8 + (ulong)local_198c * 4) = auVar1;
    local_12b8 = vpsrldq_avx(*(undefined1 (*) [16])(local_1728 + (ulong)local_198c * 4),8);
    local_12bc = 0x3f;
    auVar6 = vpsrlq_avx(local_12b8,ZEXT416(0x3f));
    local_12d8 = vpslldq_avx(*(undefined1 (*) [16])(local_1728 + (ulong)local_198c * 4),8);
    local_12dc = 0x3f;
    auVar1 = vpsrlq_avx(local_12d8,ZEXT416(0x3f));
    local_cd8 = local_1728[(ulong)local_198c * 4];
    uStack_cd0 = local_1728[(ulong)local_198c * 4 + 1];
    local_cdc = 1;
    auVar21._8_8_ = local_1728[(ulong)local_198c * 4 + 1];
    auVar21._0_8_ = local_1728[(ulong)local_198c * 4];
    local_fb8 = vpsllq_avx(auVar21,ZEXT416(1));
    local_1a18 = auVar1._0_8_;
    uStack_1a10 = auVar1._8_8_;
    local_fc8 = local_1a18;
    uStack_fc0 = uStack_1a10;
    auVar1 = vpor_avx(local_fb8,auVar1);
    *(undefined1 (*) [16])(local_1788 + (ulong)local_198c * 4) = auVar1;
    local_12f8 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1718 + (ulong)local_198c * 4),8);
    local_12fc = 0x3f;
    auVar1 = vpsrlq_avx(local_12f8,ZEXT416(0x3f));
    local_cf8 = auStack_1718[(ulong)local_198c * 4];
    uStack_cf0 = auStack_1718[(ulong)local_198c * 4 + 1];
    local_cfc = 1;
    auVar20._8_8_ = auStack_1718[(ulong)local_198c * 4 + 1];
    auVar20._0_8_ = auStack_1718[(ulong)local_198c * 4];
    local_fd8 = vpsllq_avx(auVar20,ZEXT416(1));
    local_1a18 = auVar1._0_8_;
    uStack_1a10 = auVar1._8_8_;
    local_fe8 = local_1a18;
    uStack_fe0 = uStack_1a10;
    auVar1 = vpor_avx(local_fd8,auVar1);
    *(undefined1 (*) [16])(auStack_1778 + (ulong)local_198c * 4) = auVar1;
    local_1a08 = auVar6._0_8_;
    uStack_1a00 = auVar6._8_8_;
    local_ff8 = auStack_1778[(ulong)local_198c * 4];
    uStack_ff0 = auStack_1778[(ulong)local_198c * 4 + 1];
    local_1008 = local_1a08;
    uStack_1000 = uStack_1a00;
    auVar16._8_8_ = auStack_1778[(ulong)local_198c * 4 + 1];
    auVar16._0_8_ = auStack_1778[(ulong)local_198c * 4];
    auVar1 = vpor_avx(auVar16,auVar6);
    *(undefined1 (*) [16])(auStack_1778 + (ulong)local_198c * 4) = auVar1;
  }
  for (local_1a1c = 0; local_1a1c < 3; local_1a1c = local_1a1c + 1) {
    uVar51 = (local_1a1c + 1) % 3;
    uVar44 = (ulong)local_1a1c;
    uVar45 = (ulong)local_1a1c;
    local_1498 = &local_1a48;
    local_14a0 = local_1848 + uVar44 * 4;
    local_14a8 = local_18a8 + uVar45 * 4;
    local_758 = local_1848[uVar44 * 4];
    local_768 = local_18a8[uVar45 * 4];
    uStack_750 = local_1848[uVar44 * 4 + 1];
    uStack_760 = local_18a8[uVar45 * 4 + 1];
    auVar29._8_8_ = local_1848[uVar44 * 4 + 1];
    auVar29._0_8_ = local_758;
    auVar28._8_8_ = local_18a8[uVar45 * 4 + 1];
    auVar28._0_8_ = local_768;
    auVar2 = vpand_avx(auVar29,auVar28);
    local_778 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4);
    uStack_770 = auStack_1838[uVar44 * 4 + 1];
    local_788 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1898 + uVar45 * 4);
    uStack_780 = auStack_1898[uVar45 * 4 + 1];
    auVar3 = vpand_avx(*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_1898 + uVar45 * 4));
    uStack_1a30 = auVar3._8_8_;
    local_1a38 = auVar3._0_8_;
    uVar44 = (ulong)uVar51;
    uVar45 = (ulong)local_1a1c;
    local_14b0 = &local_1a68;
    local_14b8 = local_1848 + uVar44 * 4;
    local_14c0 = local_18a8 + uVar45 * 4;
    local_718 = local_1848[uVar44 * 4];
    local_728 = local_18a8[uVar45 * 4];
    uStack_710 = local_1848[uVar44 * 4 + 1];
    uStack_720 = local_18a8[uVar45 * 4 + 1];
    auVar31._8_8_ = local_1848[uVar44 * 4 + 1];
    auVar31._0_8_ = local_718;
    auVar30._8_8_ = local_18a8[uVar45 * 4 + 1];
    auVar30._0_8_ = local_728;
    auVar3 = vpand_avx(auVar31,auVar30);
    local_738 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4);
    uStack_730 = auStack_1838[uVar44 * 4 + 1];
    local_748 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1898 + uVar45 * 4);
    uStack_740 = auStack_1898[uVar45 * 4 + 1];
    auVar4 = vpand_avx(*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_1898 + uVar45 * 4));
    uStack_1a50 = auVar4._8_8_;
    local_1a58 = auVar4._0_8_;
    uVar44 = (ulong)local_1a1c;
    local_a10 = local_1668 + uVar44 * 4;
    local_a18 = &local_1a48;
    local_a20 = &local_1a68;
    local_1a48 = auVar2._0_8_;
    uStack_1a40 = auVar2._8_8_;
    local_1a68 = auVar3._0_8_;
    uStack_1a60 = auVar3._8_8_;
    local_1668[uVar44 * 4] = local_1a48 ^ local_1a68;
    local_1668[uVar44 * 4 + 1] = uStack_1a40 ^ uStack_1a60;
    auStack_1658[uVar44 * 4] = local_1a38 ^ local_1a58;
    auStack_1658[uVar44 * 4 + 1] = uStack_1a30 ^ uStack_1a50;
    uVar44 = (ulong)local_1a1c;
    uVar45 = (ulong)uVar51;
    local_14c8 = &local_1a48;
    local_14d0 = local_1848 + uVar44 * 4;
    local_14d8 = local_18a8 + uVar45 * 4;
    local_6d8 = local_1848[uVar44 * 4];
    local_6e8 = local_18a8[uVar45 * 4];
    uStack_6d0 = local_1848[uVar44 * 4 + 1];
    uStack_6e0 = local_18a8[uVar45 * 4 + 1];
    auVar33._8_8_ = local_1848[uVar44 * 4 + 1];
    auVar33._0_8_ = local_6d8;
    auVar32._8_8_ = local_18a8[uVar45 * 4 + 1];
    auVar32._0_8_ = local_6e8;
    auVar2 = vpand_avx(auVar33,auVar32);
    local_6f8 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4);
    uStack_6f0 = auStack_1838[uVar44 * 4 + 1];
    local_708 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1898 + uVar45 * 4);
    uStack_700 = auStack_1898[uVar45 * 4 + 1];
    auVar3 = vpand_avx(*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_1898 + uVar45 * 4));
    uStack_1a30 = auVar3._8_8_;
    local_1a38 = auVar3._0_8_;
    uVar45 = (ulong)local_1a1c;
    uVar46 = (ulong)local_1a1c;
    local_a28 = local_1668 + uVar45 * 4;
    local_a30 = local_1668 + uVar46 * 4;
    local_a38 = &local_1a48;
    uVar44 = local_1668[uVar46 * 4 + 1];
    local_1a48 = auVar2._0_8_;
    uStack_1a40 = auVar2._8_8_;
    local_1668[uVar45 * 4] = local_1668[uVar46 * 4] ^ local_1a48;
    local_1668[uVar45 * 4 + 1] = uVar44 ^ uStack_1a40;
    uVar44 = auStack_1658[uVar46 * 4 + 1];
    auStack_1658[uVar45 * 4] = auStack_1658[uVar46 * 4] ^ local_1a38;
    auStack_1658[uVar45 * 4 + 1] = uVar44 ^ uStack_1a30;
    uVar47 = (ulong)local_1a1c;
    uVar52 = (ulong)uVar51;
    local_a40 = &local_1a68;
    local_a48 = local_17e8 + uVar47 * 4;
    local_a50 = local_17e8 + uVar52 * 4;
    uVar44 = local_17e8[uVar47 * 4 + 1];
    uVar45 = local_17e8[uVar52 * 4 + 1];
    uVar46 = auStack_17d8[uVar47 * 4];
    uVar50 = auStack_17d8[uVar47 * 4 + 1];
    uVar53 = auStack_17d8[uVar52 * 4];
    uVar7 = auStack_17d8[uVar52 * 4 + 1];
    uVar48 = (ulong)local_1a1c;
    uVar49 = (ulong)local_1a1c;
    local_a58 = local_1668 + uVar48 * 4;
    local_a60 = local_1668 + uVar49 * 4;
    local_a68 = &local_1a68;
    uVar8 = local_1668[uVar49 * 4 + 1];
    local_1668[uVar48 * 4] =
         local_1668[uVar49 * 4] ^ local_17e8[uVar47 * 4] ^ local_17e8[uVar52 * 4];
    local_1668[uVar48 * 4 + 1] = uVar8 ^ uVar44 ^ uVar45;
    uVar44 = auStack_1658[uVar49 * 4 + 1];
    auStack_1658[uVar48 * 4] = auStack_1658[uVar49 * 4] ^ uVar46 ^ uVar53;
    auStack_1658[uVar48 * 4 + 1] = uVar44 ^ uVar50 ^ uVar7;
    local_910 = (ulong *)(in_RDX + (ulong)local_1a1c * 0x20);
    uStack_920 = local_1668[(ulong)local_1a1c * 4 + 1];
    local_928 = local_1668[(ulong)local_1a1c * 4];
    *local_910 = local_1668[(ulong)local_1a1c * 4];
    local_910[1] = uStack_920;
    lVar43 = in_RDX + (ulong)local_1a1c * 0x20;
    local_930 = (ulong *)(lVar43 + 0x10);
    uStack_940 = auStack_1658[(ulong)local_1a1c * 4 + 1];
    local_948 = auStack_1658[(ulong)local_1a1c * 4];
    *local_930 = auStack_1658[(ulong)local_1a1c * 4];
    *(ulong *)(lVar43 + 0x18) = uStack_940;
  }
  for (local_1a6c = 0; local_1a6c < 3; local_1a6c = local_1a6c + 1) {
    uVar51 = (local_1a6c + 1) % 3;
    uVar44 = (ulong)local_1a6c;
    uVar45 = (ulong)local_1a6c;
    local_14e0 = &local_1a98;
    local_14e8 = local_18a8 + uVar44 * 4;
    local_14f0 = local_1908 + uVar45 * 4;
    auVar35._8_8_ = local_18a8[uVar44 * 4 + 1];
    auVar35._0_8_ = local_18a8[uVar44 * 4];
    auVar34._8_8_ = local_1908[uVar45 * 4 + 1];
    auVar34._0_8_ = local_1908[uVar45 * 4];
    auVar2 = vpand_avx(auVar35,auVar34);
    local_6b8 = *(undefined8 *)*(undefined1 (*) [16])(auStack_1898 + uVar44 * 4);
    local_6c8 = *(undefined8 *)*(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4);
    uStack_6c0 = auStack_18f8[uVar45 * 4 + 1];
    auVar3 = vpand_avx(*(undefined1 (*) [16])(auStack_1898 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4));
    uVar44 = (ulong)uVar51;
    uVar45 = (ulong)local_1a6c;
    local_14f8 = &local_1ab8;
    local_1500 = local_18a8 + uVar44 * 4;
    local_1508 = local_1908 + uVar45 * 4;
    auVar37._8_8_ = local_18a8[uVar44 * 4 + 1];
    auVar37._0_8_ = local_18a8[uVar44 * 4];
    auVar36._8_8_ = local_1908[uVar45 * 4 + 1];
    auVar36._0_8_ = local_1908[uVar45 * 4];
    auVar4 = vpand_avx(auVar37,auVar36);
    auVar5 = vpand_avx(*(undefined1 (*) [16])(auStack_1898 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4));
    uStack_1aa0 = auVar5._8_8_;
    local_1aa8 = auVar5._0_8_;
    uVar44 = (ulong)local_1a6c;
    local_a70 = local_17e8 + uVar44 * 4;
    local_a78 = &local_1a98;
    local_a80 = &local_1ab8;
    local_1a98 = auVar2._0_8_;
    uStack_1a90 = auVar2._8_8_;
    local_1ab8 = auVar4._0_8_;
    uStack_1ab0 = auVar4._8_8_;
    local_17e8[uVar44 * 4] = local_1a98 ^ local_1ab8;
    local_17e8[uVar44 * 4 + 1] = uStack_1a90 ^ uStack_1ab0;
    local_1a88 = auVar3._0_8_;
    uStack_1a80 = auVar3._8_8_;
    auStack_17d8[uVar44 * 4] = local_1a88 ^ local_1aa8;
    auStack_17d8[uVar44 * 4 + 1] = uStack_1a80 ^ uStack_1aa0;
    uVar44 = (ulong)local_1a6c;
    uVar45 = (ulong)uVar51;
    local_1510 = &local_1a98;
    local_1518 = local_18a8 + uVar44 * 4;
    local_1520 = local_1908 + uVar45 * 4;
    auVar39._8_8_ = local_18a8[uVar44 * 4 + 1];
    auVar39._0_8_ = local_18a8[uVar44 * 4];
    auVar38._8_8_ = local_1908[uVar45 * 4 + 1];
    auVar38._0_8_ = local_1908[uVar45 * 4];
    auVar2 = vpand_avx(auVar39,auVar38);
    auVar3 = vpand_avx(*(undefined1 (*) [16])(auStack_1898 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4));
    uVar45 = (ulong)local_1a6c;
    uVar46 = (ulong)local_1a6c;
    local_a88 = local_17e8 + uVar45 * 4;
    local_a90 = local_17e8 + uVar46 * 4;
    local_a98 = &local_1a98;
    uVar44 = local_17e8[uVar46 * 4 + 1];
    local_1a98 = auVar2._0_8_;
    uStack_1a90 = auVar2._8_8_;
    local_17e8[uVar45 * 4] = local_17e8[uVar46 * 4] ^ local_1a98;
    local_17e8[uVar45 * 4 + 1] = uVar44 ^ uStack_1a90;
    uVar44 = auStack_17d8[uVar46 * 4 + 1];
    local_1a88 = auVar3._0_8_;
    uStack_1a80 = auVar3._8_8_;
    auStack_17d8[uVar45 * 4] = auStack_17d8[uVar46 * 4] ^ local_1a88;
    auStack_17d8[uVar45 * 4 + 1] = uVar44 ^ uStack_1a80;
    uVar47 = (ulong)local_1a6c;
    uVar52 = (ulong)uVar51;
    local_aa0 = &local_1ab8;
    local_aa8 = local_1788 + uVar47 * 4;
    local_ab0 = local_1788 + uVar52 * 4;
    uVar44 = local_1788[uVar47 * 4 + 1];
    uVar45 = local_1788[uVar52 * 4 + 1];
    uVar46 = auStack_1778[uVar47 * 4];
    uVar50 = auStack_1778[uVar47 * 4 + 1];
    uVar53 = auStack_1778[uVar52 * 4];
    uVar7 = auStack_1778[uVar52 * 4 + 1];
    uVar48 = (ulong)local_1a6c;
    uVar49 = (ulong)local_1a6c;
    local_ab8 = local_17e8 + uVar48 * 4;
    local_ac0 = local_17e8 + uVar49 * 4;
    local_ac8 = &local_1ab8;
    uVar8 = local_17e8[uVar49 * 4 + 1];
    local_17e8[uVar48 * 4] =
         local_17e8[uVar49 * 4] ^ local_1788[uVar47 * 4] ^ local_1788[uVar52 * 4];
    local_17e8[uVar48 * 4 + 1] = uVar8 ^ uVar44 ^ uVar45;
    uVar44 = auStack_17d8[uVar49 * 4 + 1];
    auStack_17d8[uVar48 * 4] = auStack_17d8[uVar49 * 4] ^ uVar46 ^ uVar53;
    auStack_17d8[uVar48 * 4 + 1] = uVar44 ^ uVar50 ^ uVar7;
    local_d18 = vpslldq_avx(*(undefined1 (*) [16])(auStack_17d8 + (ulong)local_1a6c * 4),8);
    local_d1c = 0x3f;
    auVar3 = vpsllq_avx(local_d18,ZEXT416(0x3f));
    local_d38 = vpsrldq_avx(*(undefined1 (*) [16])(local_17e8 + (ulong)local_1a6c * 4),8);
    local_d3c = 0x3f;
    auVar2 = vpsllq_avx(local_d38,ZEXT416(0x3f));
    local_1318 = local_17e8[(ulong)local_1a6c * 4];
    uStack_1310 = local_17e8[(ulong)local_1a6c * 4 + 1];
    local_131c = 1;
    auVar14._8_8_ = local_17e8[(ulong)local_1a6c * 4 + 1];
    auVar14._0_8_ = local_17e8[(ulong)local_1a6c * 4];
    local_1018 = vpsrlq_avx(auVar14,ZEXT416(1));
    local_1ad8 = auVar2._0_8_;
    uStack_1ad0 = auVar2._8_8_;
    local_1028 = local_1ad8;
    uStack_1020 = uStack_1ad0;
    auVar2 = vpor_avx(local_1018,auVar2);
    local_d58 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_17d8 + (ulong)local_1a6c * 4),8);
    local_d5c = 0x3f;
    auVar4 = vpsllq_avx(local_d58,ZEXT416(0x3f));
    local_1338 = auStack_17d8[(ulong)local_1a6c * 4];
    uStack_1330 = auStack_17d8[(ulong)local_1a6c * 4 + 1];
    local_133c = 1;
    auVar13._8_8_ = auStack_17d8[(ulong)local_1a6c * 4 + 1];
    auVar13._0_8_ = auStack_17d8[(ulong)local_1a6c * 4];
    local_1038 = vpsrlq_avx(auVar13,ZEXT416(1));
    local_1ad8 = auVar4._0_8_;
    uStack_1ad0 = auVar4._8_8_;
    local_1048 = local_1ad8;
    uStack_1040 = uStack_1ad0;
    vpor_avx(local_1038,auVar4);
    local_1a98 = auVar2._0_8_;
    uStack_1a90 = auVar2._8_8_;
    local_1ac8 = auVar3._0_8_;
    uStack_1ac0 = auVar3._8_8_;
    local_1058 = local_1a98;
    uStack_1050 = uStack_1a90;
    local_1068 = local_1ac8;
    uStack_1060 = uStack_1ac0;
    auVar2 = vpor_avx(auVar2,auVar3);
    local_15c0 = (ulong *)(in_RDX + (ulong)local_1a6c * 0x20);
    uVar44 = local_15c0[1];
    local_15c8 = in_RDX + (ulong)local_1a6c * 0x20 + 0x10;
    local_ad0 = &local_1ab8;
    local_ad8 = &local_1a98;
    local_ae0 = &local_1ab8;
    local_1a98 = auVar2._0_8_;
    uStack_1a90 = auVar2._8_8_;
    local_988 = local_1a88 ^ uVar46 ^ uVar53;
    uStack_980 = uStack_1a80 ^ uVar50 ^ uVar7;
    local_950 = (ulong *)(in_RDX + (ulong)local_1a6c * 0x20);
    local_968 = local_1a98 ^ *local_15c0;
    uStack_960 = uStack_1a90 ^ uVar44;
    *local_950 = local_1a98 ^ *local_15c0;
    local_950[1] = uStack_1a90 ^ uVar44;
    lVar43 = in_RDX + (ulong)local_1a6c * 0x20;
    local_970 = (ulong *)(lVar43 + 0x10);
    *local_970 = local_988;
    *(ulong *)(lVar43 + 0x18) = uStack_980;
  }
  for (local_1adc = 0; local_1adc < 3; local_1adc = local_1adc + 1) {
    uVar51 = (local_1adc + 1) % 3;
    uVar44 = (ulong)local_1adc;
    uVar45 = (ulong)local_1adc;
    local_1528 = &local_1b08;
    local_1530 = local_1848 + uVar44 * 4;
    local_1538 = local_1908 + uVar45 * 4;
    auVar40._8_8_ = local_1848[uVar44 * 4 + 1];
    auVar40._0_8_ = local_1848[uVar44 * 4];
    auVar3._8_8_ = local_1908[uVar45 * 4 + 1];
    auVar3._0_8_ = local_1908[uVar45 * 4];
    auVar2 = vpand_avx(auVar40,auVar3);
    auVar3 = vpand_avx(*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4));
    uVar44 = (ulong)uVar51;
    uVar45 = (ulong)local_1adc;
    local_1540 = &local_1b28;
    local_1548 = local_1848 + uVar44 * 4;
    local_1550 = local_1908 + uVar45 * 4;
    auVar42._8_8_ = local_1848[uVar44 * 4 + 1];
    auVar42._0_8_ = local_1848[uVar44 * 4];
    auVar41._8_8_ = local_1908[uVar45 * 4 + 1];
    auVar41._0_8_ = local_1908[uVar45 * 4];
    auVar4 = vpand_avx(auVar42,auVar41);
    auVar5 = vpand_avx(*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4));
    uStack_1b10 = auVar5._8_8_;
    local_1b18 = auVar5._0_8_;
    uVar44 = (ulong)local_1adc;
    local_ae8 = local_1728 + uVar44 * 4;
    local_af0 = &local_1b08;
    local_af8 = &local_1b28;
    local_1b08 = auVar2._0_8_;
    uStack_1b00 = auVar2._8_8_;
    local_1b28 = auVar4._0_8_;
    uStack_1b20 = auVar4._8_8_;
    local_1728[uVar44 * 4] = local_1b08 ^ local_1b28;
    local_1728[uVar44 * 4 + 1] = uStack_1b00 ^ uStack_1b20;
    local_1af8 = auVar3._0_8_;
    uStack_1af0 = auVar3._8_8_;
    auStack_1718[uVar44 * 4] = local_1af8 ^ local_1b18;
    auStack_1718[uVar44 * 4 + 1] = uStack_1af0 ^ uStack_1b10;
    uVar44 = (ulong)local_1adc;
    uVar45 = (ulong)uVar51;
    local_1558 = &local_1b08;
    local_1560 = local_1848 + uVar44 * 4;
    local_1568 = local_1908 + uVar45 * 4;
    auVar6._8_8_ = local_1848[uVar44 * 4 + 1];
    auVar6._0_8_ = local_1848[uVar44 * 4];
    auVar1._8_8_ = local_1908[uVar45 * 4 + 1];
    auVar1._0_8_ = local_1908[uVar45 * 4];
    auVar2 = vpand_avx(auVar6,auVar1);
    auVar3 = vpand_avx(*(undefined1 (*) [16])(auStack_1838 + uVar44 * 4),
                       *(undefined1 (*) [16])(auStack_18f8 + uVar45 * 4));
    uVar45 = (ulong)local_1adc;
    uVar46 = (ulong)local_1adc;
    local_b00 = local_1728 + uVar45 * 4;
    local_b08 = local_1728 + uVar46 * 4;
    local_b10 = &local_1b08;
    uVar44 = local_1728[uVar46 * 4 + 1];
    local_1b08 = auVar2._0_8_;
    uStack_1b00 = auVar2._8_8_;
    local_1728[uVar45 * 4] = local_1728[uVar46 * 4] ^ local_1b08;
    local_1728[uVar45 * 4 + 1] = uVar44 ^ uStack_1b00;
    uVar44 = auStack_1718[uVar46 * 4 + 1];
    local_1af8 = auVar3._0_8_;
    uStack_1af0 = auVar3._8_8_;
    auStack_1718[uVar45 * 4] = auStack_1718[uVar46 * 4] ^ local_1af8;
    auStack_1718[uVar45 * 4 + 1] = uVar44 ^ uStack_1af0;
    uVar47 = (ulong)local_1adc;
    uVar52 = (ulong)uVar51;
    local_b18 = &local_1b28;
    local_b20 = local_16c8 + uVar47 * 4;
    local_b28 = local_16c8 + uVar52 * 4;
    uVar44 = local_16c8[uVar47 * 4 + 1];
    uVar45 = local_16c8[uVar52 * 4 + 1];
    uVar46 = auStack_16b8[uVar47 * 4];
    uVar50 = auStack_16b8[uVar47 * 4 + 1];
    uVar53 = auStack_16b8[uVar52 * 4];
    uVar7 = auStack_16b8[uVar52 * 4 + 1];
    uVar48 = (ulong)local_1adc;
    uVar49 = (ulong)local_1adc;
    local_b30 = local_1728 + uVar48 * 4;
    local_b38 = local_1728 + uVar49 * 4;
    local_b40 = &local_1b28;
    uVar8 = local_1728[uVar49 * 4 + 1];
    local_1728[uVar48 * 4] =
         local_1728[uVar49 * 4] ^ local_16c8[uVar47 * 4] ^ local_16c8[uVar52 * 4];
    local_1728[uVar48 * 4 + 1] = uVar8 ^ uVar44 ^ uVar45;
    uVar44 = auStack_1718[uVar49 * 4 + 1];
    auStack_1718[uVar48 * 4] = auStack_1718[uVar49 * 4] ^ uVar46 ^ uVar53;
    auStack_1718[uVar48 * 4 + 1] = uVar44 ^ uVar50 ^ uVar7;
    local_d78 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1718 + (ulong)local_1adc * 4),8);
    local_d7c = 0x3e;
    auVar3 = vpsllq_avx(local_d78,ZEXT416(0x3e));
    local_d98 = vpsrldq_avx(*(undefined1 (*) [16])(local_1728 + (ulong)local_1adc * 4),8);
    local_d9c = 0x3e;
    auVar2 = vpsllq_avx(local_d98,ZEXT416(0x3e));
    local_1358 = local_1728[(ulong)local_1adc * 4];
    uStack_1350 = local_1728[(ulong)local_1adc * 4 + 1];
    local_135c = 2;
    auVar12._8_8_ = local_1728[(ulong)local_1adc * 4 + 1];
    auVar12._0_8_ = local_1728[(ulong)local_1adc * 4];
    local_1078 = vpsrlq_avx(auVar12,ZEXT416(2));
    local_1b48 = auVar2._0_8_;
    uStack_1b40 = auVar2._8_8_;
    local_1088 = local_1b48;
    uStack_1080 = uStack_1b40;
    auVar2 = vpor_avx(local_1078,auVar2);
    local_db8 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_1718 + (ulong)local_1adc * 4),8);
    local_dbc = 0x3e;
    auVar4 = vpsllq_avx(local_db8,ZEXT416(0x3e));
    local_1378 = auStack_1718[(ulong)local_1adc * 4];
    uStack_1370 = auStack_1718[(ulong)local_1adc * 4 + 1];
    local_137c = 2;
    auVar11._8_8_ = auStack_1718[(ulong)local_1adc * 4 + 1];
    auVar11._0_8_ = auStack_1718[(ulong)local_1adc * 4];
    local_1098 = vpsrlq_avx(auVar11,ZEXT416(2));
    local_1b48 = auVar4._0_8_;
    uStack_1b40 = auVar4._8_8_;
    local_10a8 = local_1b48;
    uStack_10a0 = uStack_1b40;
    vpor_avx(local_1098,auVar4);
    local_1b08 = auVar2._0_8_;
    uStack_1b00 = auVar2._8_8_;
    local_1b38 = auVar3._0_8_;
    uStack_1b30 = auVar3._8_8_;
    local_10b8 = local_1b08;
    uStack_10b0 = uStack_1b00;
    local_10c8 = local_1b38;
    uStack_10c0 = uStack_1b30;
    auVar2 = vpor_avx(auVar2,auVar3);
    local_15d0 = (ulong *)(in_RDX + (ulong)local_1adc * 0x20);
    uVar44 = local_15d0[1];
    local_15d8 = in_RDX + (ulong)local_1adc * 0x20 + 0x10;
    local_b48 = &local_1b28;
    local_b50 = &local_1b08;
    local_b58 = &local_1b28;
    local_1b08 = auVar2._0_8_;
    uStack_1b00 = auVar2._8_8_;
    local_9c8 = local_1af8 ^ uVar46 ^ uVar53;
    uStack_9c0 = uStack_1af0 ^ uVar50 ^ uVar7;
    local_990 = (ulong *)(in_RDX + (ulong)local_1adc * 0x20);
    local_9a8 = local_1b08 ^ *local_15d0;
    uStack_9a0 = uStack_1b00 ^ uVar44;
    *local_990 = local_1b08 ^ *local_15d0;
    local_990[1] = uStack_1b00 ^ uVar44;
    lVar43 = in_RDX + (ulong)local_1adc * 0x20;
    local_9b0 = (ulong *)(lVar43 + 0x10);
    *local_9b0 = local_9c8;
    *(ulong *)(lVar43 + 0x18) = uStack_9c0;
  }
  for (local_1b4c = 0; local_1b4c < 3; local_1b4c = local_1b4c + 1) {
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_b60 = local_17e8 + uVar46 * 4;
    local_b68 = local_17e8 + uVar50 * 4;
    local_b70 = local_1848 + uVar53 * 4;
    uVar44 = local_17e8[uVar50 * 4 + 1];
    uVar45 = local_1848[uVar53 * 4 + 1];
    local_17e8[uVar46 * 4] = local_17e8[uVar50 * 4] ^ local_1848[uVar53 * 4];
    local_17e8[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_17d8[uVar50 * 4 + 1];
    uVar45 = auStack_1838[uVar53 * 4 + 1];
    auStack_17d8[uVar46 * 4] = auStack_17d8[uVar50 * 4] ^ auStack_1838[uVar53 * 4];
    auStack_17d8[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_b78 = local_1848 + uVar46 * 4;
    local_b80 = local_1848 + uVar50 * 4;
    local_b88 = local_18a8 + uVar53 * 4;
    uVar44 = local_1848[uVar50 * 4 + 1];
    uVar45 = local_18a8[uVar53 * 4 + 1];
    local_1848[uVar46 * 4] = local_1848[uVar50 * 4] ^ local_18a8[uVar53 * 4];
    local_1848[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_1838[uVar50 * 4 + 1];
    uVar45 = auStack_1898[uVar53 * 4 + 1];
    auStack_1838[uVar46 * 4] = auStack_1838[uVar50 * 4] ^ auStack_1898[uVar53 * 4];
    auStack_1838[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_b90 = local_1728 + uVar46 * 4;
    local_b98 = local_1848 + uVar50 * 4;
    local_ba0 = local_1728 + uVar53 * 4;
    uVar44 = local_1848[uVar50 * 4 + 1];
    uVar45 = local_1728[uVar53 * 4 + 1];
    local_1728[uVar46 * 4] = local_1848[uVar50 * 4] ^ local_1728[uVar53 * 4];
    local_1728[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_1838[uVar50 * 4 + 1];
    uVar45 = auStack_1718[uVar53 * 4 + 1];
    auStack_1718[uVar46 * 4] = auStack_1838[uVar50 * 4] ^ auStack_1718[uVar53 * 4];
    auStack_1718[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_ba8 = local_1668 + uVar46 * 4;
    local_bb0 = local_1848 + uVar50 * 4;
    local_bb8 = local_1668 + uVar53 * 4;
    uVar44 = local_1848[uVar50 * 4 + 1];
    uVar45 = local_1668[uVar53 * 4 + 1];
    local_1668[uVar46 * 4] = local_1848[uVar50 * 4] ^ local_1668[uVar53 * 4];
    local_1668[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_1838[uVar50 * 4 + 1];
    uVar45 = auStack_1658[uVar53 * 4 + 1];
    auStack_1658[uVar46 * 4] = auStack_1838[uVar50 * 4] ^ auStack_1658[uVar53 * 4];
    auStack_1658[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_bc0 = local_1668 + uVar46 * 4;
    local_bc8 = local_1668 + uVar50 * 4;
    local_bd0 = local_1908 + uVar53 * 4;
    uVar44 = local_1668[uVar50 * 4 + 1];
    uVar45 = local_1908[uVar53 * 4 + 1];
    local_1668[uVar46 * 4] = local_1668[uVar50 * 4] ^ local_1908[uVar53 * 4];
    local_1668[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_1658[uVar50 * 4 + 1];
    uVar45 = auStack_18f8[uVar53 * 4 + 1];
    auStack_1658[uVar46 * 4] = auStack_1658[uVar50 * 4] ^ auStack_18f8[uVar53 * 4];
    auStack_1658[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    local_dd8 = vpslldq_avx(*(undefined1 (*) [16])(auStack_17d8 + (ulong)local_1b4c * 4),8);
    local_ddc = 0x3e;
    auVar3 = vpsllq_avx(local_dd8,ZEXT416(0x3e));
    local_df8 = vpsrldq_avx(*(undefined1 (*) [16])(local_17e8 + (ulong)local_1b4c * 4),8);
    local_dfc = 0x3e;
    auVar2 = vpsllq_avx(local_df8,ZEXT416(0x3e));
    local_1398 = local_17e8[(ulong)local_1b4c * 4];
    uStack_1390 = local_17e8[(ulong)local_1b4c * 4 + 1];
    local_139c = 2;
    auVar10._8_8_ = local_17e8[(ulong)local_1b4c * 4 + 1];
    auVar10._0_8_ = local_17e8[(ulong)local_1b4c * 4];
    local_10d8 = vpsrlq_avx(auVar10,ZEXT416(2));
    local_1b78 = auVar2._0_8_;
    uStack_1b70 = auVar2._8_8_;
    local_10e8 = local_1b78;
    uStack_10e0 = uStack_1b70;
    auVar2 = vpor_avx(local_10d8,auVar2);
    *(undefined1 (*) [16])(local_1848 + (ulong)local_1b4c * 4) = auVar2;
    local_e18 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_17d8 + (ulong)local_1b4c * 4),8);
    local_e1c = 0x3e;
    auVar2 = vpsllq_avx(local_e18,ZEXT416(0x3e));
    local_13b8 = auStack_17d8[(ulong)local_1b4c * 4];
    uStack_13b0 = auStack_17d8[(ulong)local_1b4c * 4 + 1];
    local_13bc = 2;
    auVar9._8_8_ = auStack_17d8[(ulong)local_1b4c * 4 + 1];
    auVar9._0_8_ = auStack_17d8[(ulong)local_1b4c * 4];
    local_10f8 = vpsrlq_avx(auVar9,ZEXT416(2));
    local_1b78 = auVar2._0_8_;
    uStack_1b70 = auVar2._8_8_;
    local_1108 = local_1b78;
    uStack_1100 = uStack_1b70;
    auVar2 = vpor_avx(local_10f8,auVar2);
    *(undefined1 (*) [16])(auStack_1838 + (ulong)local_1b4c * 4) = auVar2;
    local_1b68 = auVar3._0_8_;
    uStack_1b60 = auVar3._8_8_;
    local_1118 = local_1848[(ulong)local_1b4c * 4];
    uStack_1110 = local_1848[(ulong)local_1b4c * 4 + 1];
    local_1128 = local_1b68;
    uStack_1120 = uStack_1b60;
    auVar15._8_8_ = local_1848[(ulong)local_1b4c * 4 + 1];
    auVar15._0_8_ = local_1848[(ulong)local_1b4c * 4];
    auVar2 = vpor_avx(auVar15,auVar3);
    *(undefined1 (*) [16])(local_1848 + (ulong)local_1b4c * 4) = auVar2;
    local_e38 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1718 + (ulong)local_1b4c * 4),8);
    local_e3c = 0x3f;
    auVar3 = vpsllq_avx(local_e38,ZEXT416(0x3f));
    local_e58 = vpsrldq_avx(*(undefined1 (*) [16])(local_1728 + (ulong)local_1b4c * 4),8);
    local_e5c = 0x3f;
    auVar2 = vpsllq_avx(local_e58,ZEXT416(0x3f));
    local_13d8 = local_1728[(ulong)local_1b4c * 4];
    uStack_13d0 = local_1728[(ulong)local_1b4c * 4 + 1];
    local_13dc = 1;
    auVar5._8_8_ = local_1728[(ulong)local_1b4c * 4 + 1];
    auVar5._0_8_ = local_1728[(ulong)local_1b4c * 4];
    local_1138 = vpsrlq_avx(auVar5,ZEXT416(1));
    local_1b98 = auVar2._0_8_;
    uStack_1b90 = auVar2._8_8_;
    local_1148 = local_1b98;
    uStack_1140 = uStack_1b90;
    auVar2 = vpor_avx(local_1138,auVar2);
    *(undefined1 (*) [16])(local_18a8 + (ulong)local_1b4c * 4) = auVar2;
    local_e78 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_1718 + (ulong)local_1b4c * 4),8);
    local_e7c = 0x3f;
    auVar2 = vpsllq_avx(local_e78,ZEXT416(0x3f));
    local_13f8 = auStack_1718[(ulong)local_1b4c * 4];
    uStack_13f0 = auStack_1718[(ulong)local_1b4c * 4 + 1];
    local_13fc = 1;
    auVar4._8_8_ = auStack_1718[(ulong)local_1b4c * 4 + 1];
    auVar4._0_8_ = auStack_1718[(ulong)local_1b4c * 4];
    local_1158 = vpsrlq_avx(auVar4,ZEXT416(1));
    local_1b98 = auVar2._0_8_;
    uStack_1b90 = auVar2._8_8_;
    local_1168 = local_1b98;
    uStack_1160 = uStack_1b90;
    auVar2 = vpor_avx(local_1158,auVar2);
    *(undefined1 (*) [16])(auStack_1898 + (ulong)local_1b4c * 4) = auVar2;
    local_1b88 = auVar3._0_8_;
    uStack_1b80 = auVar3._8_8_;
    local_1178 = local_18a8[(ulong)local_1b4c * 4];
    uStack_1170 = local_18a8[(ulong)local_1b4c * 4 + 1];
    local_1188 = local_1b88;
    uStack_1180 = uStack_1b80;
    auVar2._8_8_ = local_18a8[(ulong)local_1b4c * 4 + 1];
    auVar2._0_8_ = local_18a8[(ulong)local_1b4c * 4];
    auVar2 = vpor_avx(auVar2,auVar3);
    *(undefined1 (*) [16])(local_18a8 + (ulong)local_1b4c * 4) = auVar2;
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_bd8 = local_1848 + uVar46 * 4;
    local_be0 = local_1848 + uVar50 * 4;
    local_be8 = local_18a8 + uVar53 * 4;
    uVar44 = local_1848[uVar50 * 4 + 1];
    uVar45 = local_18a8[uVar53 * 4 + 1];
    local_1848[uVar46 * 4] = local_1848[uVar50 * 4] ^ local_18a8[uVar53 * 4];
    local_1848[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_1838[uVar50 * 4 + 1];
    uVar45 = auStack_1898[uVar53 * 4 + 1];
    auStack_1838[uVar46 * 4] = auStack_1838[uVar50 * 4] ^ auStack_1898[uVar53 * 4];
    auStack_1838[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar46 = (ulong)local_1b4c;
    uVar50 = (ulong)local_1b4c;
    uVar53 = (ulong)local_1b4c;
    local_bf0 = local_1668 + uVar46 * 4;
    local_bf8 = local_1668 + uVar50 * 4;
    local_c00 = local_1848 + uVar53 * 4;
    uVar44 = local_1668[uVar50 * 4 + 1];
    uVar45 = local_1848[uVar53 * 4 + 1];
    local_1668[uVar46 * 4] = local_1668[uVar50 * 4] ^ local_1848[uVar53 * 4];
    local_1668[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    uVar44 = auStack_1658[uVar50 * 4 + 1];
    uVar45 = auStack_1838[uVar53 * 4 + 1];
    auStack_1658[uVar46 * 4] = auStack_1658[uVar50 * 4] ^ auStack_1838[uVar53 * 4];
    auStack_1658[uVar46 * 4 + 1] = uVar44 ^ uVar45;
    local_9d0 = (ulong *)(in_RDI + (ulong)local_1b4c * 0x20);
    uStack_9e0 = local_1668[(ulong)local_1b4c * 4 + 1];
    local_9e8 = local_1668[(ulong)local_1b4c * 4];
    *local_9d0 = local_1668[(ulong)local_1b4c * 4];
    local_9d0[1] = uStack_9e0;
    lVar43 = in_RDI + (ulong)local_1b4c * 0x20;
    local_9f0 = (ulong *)(lVar43 + 0x10);
    uStack_a00 = auStack_1658[(ulong)local_1b4c * 4 + 1];
    local_a08 = auStack_1658[(ulong)local_1b4c * 4];
    *local_9f0 = auStack_1658[(ulong)local_1b4c * 4];
    *(ulong *)(lVar43 + 0x18) = uStack_a00;
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_prove_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                           const rvec_t* rvec, const mzd_local_t* mask_a,
                                           const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_PROOF, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_def(NROLR, r0m, x0s, x1s, r2m, 0);
  // b & c
  mpc_mm128_256_and_def(mm128_shift_right_256, r2m, x1s, x2m, r1s, 1);
  // c & a
  mpc_mm128_256_and_def(mm128_shift_right_256, r1m, x0s, x2m, r0s, 2);

  bitsliced_mm128_256_step_2(SC_PROOF);
}